

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

void cfgSet(dataRefsLT idx,int v)

{
  LTError *this;
  char *pcVar1;
  XPLMDataRef pvVar2;
  undefined4 in_ESI;
  uint in_EDI;
  
  if ((-1 < (int)in_EDI) && ((int)in_EDI < 0x6f)) {
    if (gDR[in_EDI] == (XPLMDataRef)0x0) {
      pcVar1 = DataRefs::dataRefDefinitionT::operator_cast_to_char_((dataRefDefinitionT *)0x1fa2d3);
      pvVar2 = (XPLMDataRef)XPLMFindDataRef(pcVar1);
      gDR[in_EDI] = pvVar2;
    }
    if (gDR[in_EDI] != (XPLMDataRef)0x0) {
      XPLMSetDatai(gDR[in_EDI],in_ESI);
    }
    return;
  }
  this = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTImgWindow.cpp"
                   ,0x2d,"cfgSet",logFATAL,"ASSERT FAILED: %s","0 <= idx && idx < CNT_DATAREFS_LT");
  __cxa_throw(this,&LTError::typeinfo,LTError::~LTError);
}

Assistant:

void cfgSet (dataRefsLT idx, int v)
{
    LOG_ASSERT(0 <= idx && idx < CNT_DATAREFS_LT);
    if (!gDR[idx])
        gDR[idx] = XPLMFindDataRef(DATA_REFS_LT[idx]);
    if (gDR[idx]) XPLMSetDatai(gDR[idx], v);
}